

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O2

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_formatter
          (ansicolor_sink<spdlog::details::console_mutex> *this,
          unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *sink_formatter)

{
  pthread_mutex_t *__mutex;
  
  __mutex = (pthread_mutex_t *)this->mutex_;
  CLI::std::mutex::lock((mutex *)&__mutex->__data);
  std::__uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::operator=
            ((__uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             &this->formatter_,
             (__uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *)
             sink_formatter);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_formatter(
    std::unique_ptr<spdlog::formatter> sink_formatter) {
    std::lock_guard<mutex_t> lock(mutex_);
    formatter_ = std::move(sink_formatter);
}